

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Header * readJPG(string *filename)

{
  byte bVar1;
  char cVar2;
  _Ios_Openmode _Var3;
  Header *this;
  ostream *poVar4;
  Header *local_268;
  uint local_248;
  byte local_243;
  byte local_242 [2];
  uint i;
  byte current;
  byte last;
  Header *local_238;
  Header *header;
  long local_220;
  ifstream inFile;
  string *filename_local;
  
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_220,(string *)filename,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    this = (Header *)operator_new(0x1e70,(nothrow_t *)&std::nothrow);
    local_242[1] = 0;
    local_268 = (Header *)0x0;
    if (this != (Header *)0x0) {
      local_242[1] = 1;
      _i = this;
      Header::Header(this);
      local_268 = this;
    }
    local_238 = local_268;
    if (local_268 == (Header *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Memory error");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ifstream::close();
      filename_local = (string *)0x0;
    }
    else {
      local_242[0] = std::istream::get();
      cVar2 = std::istream::get();
      if ((local_242[0] == 0xff) && (cVar2 == -0x28)) {
        local_242[0] = std::istream::get();
        local_243 = std::istream::get();
        while ((local_238->valid & 1U) != 0) {
          bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
          if ((bVar1 & 1) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Error File ended premature");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_238->valid = false;
            std::ifstream::close();
            filename_local = (string *)local_238;
            goto LAB_001049a0;
          }
          if (local_242[0] != 0xff) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Error expected a marker");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_238->valid = false;
            std::ifstream::close();
            filename_local = (string *)local_238;
            goto LAB_001049a0;
          }
          if (local_243 == 0xc0) {
            local_238->frameType = 0xc0;
            readStartOfFrame((ifstream *)&local_220,local_238);
LAB_001043fb:
            local_242[0] = std::istream::get();
            local_243 = std::istream::get();
          }
          else {
            if ((0xdf < local_243) && (local_243 < 0xf0)) {
              readAPPN((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if (local_243 == 0xdb) {
              readQuantizationTable((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if (local_243 == 0xdd) {
              readRestartInterval((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if (local_243 == 0xc4) {
              readHuffmanTable((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if (local_243 == 0xda) {
              readStartOfScan((ifstream *)&local_220,local_238);
              break;
            }
            if (local_243 == 0xfe) {
              readComment((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if ((((0xef < local_243) && (local_243 < 0xfe)) || (local_243 == 0xdc)) ||
               ((local_243 == 0xde || (local_243 == 0xdf)))) {
              readComment((ifstream *)&local_220,local_238);
              goto LAB_001043fb;
            }
            if (local_243 == 1) goto LAB_001043fb;
            if (local_243 != 0xff) {
              if (local_243 == 0xd8) {
                std::operator<<((ostream *)&std::cout,"Error -Embedded JPGs not supported\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
              }
              else if (local_243 == 0xd9) {
                std::operator<<((ostream *)&std::cout,"Error - EOI detected before SOS\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
              }
              else if (local_243 == 0xcc) {
                std::operator<<((ostream *)&std::cout,
                                "Error - Arithmetic Coding code not supported\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
              }
              else if ((local_243 < 0xc0) || (0xcf < local_243)) {
                if ((local_243 < 0xd0) || (0xd7 < local_243)) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Error - Unknow marker 0x:");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)local_243);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  local_238->valid = false;
                  std::ifstream::close();
                  filename_local = (string *)local_238;
                }
                else {
                  std::operator<<((ostream *)&std::cout,"Error - RSTN detected before SOS \n");
                  local_238->valid = false;
                  std::ifstream::close();
                  filename_local = (string *)local_238;
                }
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "Error - SOF marker not supported: 0x");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)local_243);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
              }
              goto LAB_001049a0;
            }
            local_243 = std::istream::get();
          }
        }
        if ((local_238->valid & 1U) == 0) {
LAB_001046db:
          if ((local_238->numComponents == '\x01') || (local_238->numComponents == '\x03')) {
            for (local_248 = 0; local_248 < local_238->numComponents; local_248 = local_248 + 1) {
              if ((local_238->quantizationTables
                   [local_238->colorComponent[local_248].quantizationTableID].set & 1U) == 0) {
                std::operator<<((ostream *)&std::cout,
                                "Error - using uninitialized quantization talbe\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
                goto LAB_001049a0;
              }
              if ((local_238->huffmanACTables
                   [local_238->colorComponent[local_248].quantizationTableID].set & 1U) == 0) {
                std::operator<<((ostream *)&std::cout,
                                "Error - using uninitialized Huffman AC talbe\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
                goto LAB_001049a0;
              }
              if ((local_238->huffmanDCTables
                   [local_238->colorComponent[local_248].quantizationTableID].set & 1U) == 0) {
                std::operator<<((ostream *)&std::cout,
                                "Error - using uninitialized Huffman DC talbe\n");
                local_238->valid = false;
                std::ifstream::close();
                filename_local = (string *)local_238;
                goto LAB_001049a0;
              }
            }
            std::ifstream::close();
            filename_local = (string *)local_238;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"Error - ");
            poVar4 = std::operator<<(poVar4,local_238->numComponents);
            std::operator<<(poVar4,"required color compoenent 1 or 3 \n");
            local_238->valid = false;
            std::ifstream::close();
            filename_local = (string *)local_238;
          }
        }
        else {
          local_243 = std::istream::get();
          do {
            while( true ) {
              while( true ) {
                while( true ) {
                  bVar1 = std::ios::operator!((ios *)((long)&local_220 +
                                                     *(long *)(local_220 + -0x18)));
                  if ((bVar1 & 1) != 0) {
                    poVar4 = std::operator<<((ostream *)&std::cout,"Error File ended premature");
                    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                    local_238->valid = false;
                    std::ifstream::close();
                    filename_local = (string *)local_238;
                    goto LAB_001049a0;
                  }
                  local_242[0] = local_243;
                  local_243 = std::istream::get();
                  if (local_242[0] == 0xff) break;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                            (&local_238->huffmanData,local_242);
                }
                if (local_243 == 0xd9) goto LAB_001046db;
                if (local_243 != 0) break;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                          (&local_238->huffmanData,local_242);
                local_243 = std::istream::get();
              }
              if ((local_243 < 0xd0) || (0xd7 < local_243)) break;
              local_243 = std::istream::get();
            }
          } while (local_243 == 0xff);
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Error Invalid marker during compressed data scan: 0x");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)local_243);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_238->valid = false;
          std::ifstream::close();
          filename_local = (string *)local_238;
        }
      }
      else {
        local_238->valid = false;
        std::ifstream::close();
        poVar4 = std::operator<<((ostream *)&std::cout,"not JPEG file");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        filename_local = (string *)local_238;
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error opening file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filename_local = (string *)0x0;
  }
LAB_001049a0:
  header._0_4_ = 1;
  std::ifstream::~ifstream(&local_220);
  return (Header *)filename_local;
}

Assistant:

Header* readJPG(const std::string filename) {
	std::ifstream inFile = std::ifstream(filename, std::ios::in | std::ios::binary);
	if (!inFile) {
		std::cout << "Error opening file" <<std::endl;
		return nullptr;
	}

	Header* header = new(std::nothrow) Header;
	if (header == nullptr) {
		std::cout << "Memory error" << std::endl;
		inFile.close();
		return nullptr;
	}

	byte last = inFile.get();
	byte current = inFile.get();

	if (last != 0xff || current != SOI) {
		header->valid = false;
		inFile.close();
		std::cout << "not JPEG file" << std::endl;
		return header;
	}

	last = inFile.get();
	current = inFile.get();
	while (header->valid) {
		if (!inFile) {
			std::cout << "Error File ended premature" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		if (last != 0xff) {
			std::cout << "Error expected a marker" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		// 读取frame类型 只支持baseline
		if (current == SOF0) {
			header->frameType = SOF0;
			readStartOfFrame(inFile, header);
		}  
		/*
			APPn的处理
			An APPn marker may appear anywhere within a JPEG file.
			By convention, applications that create APPn markers store their name at the start of the marker to prevent conflicts with other applications.
		*/
		else if (current >= APP0 && current <= APP15) {
			readAPPN(inFile, header);
		}
		/*
			DQT的处理
			An DQT marker may appear anywhere within a JPEG file.
			one restriction is if a scan requires a quantization table
			it must have been defined in a previous DQT marker
		*/
		else if (current == DQT) {
			readQuantizationTable(inFile, header);
		} 
		/*
			DRI的处理
			Define Restart Interval marker specifies the number of MCUs 
			between restart markers within the compressed data.
			A DRI marker may appear anywhere in the file to define or redefine the restart interval.
			A DRI marker must appear somwhere in the file for a compressed data segment to include restart markers
			
		*/
		else if (current == DRI) {
			readRestartInterval(inFile, header);
		}
		/*
			DHT处理，哈夫曼表
		*/
		else if (current == DHT) {
			readHuffmanTable(inFile, header);
			
		}
		/*
			Start of Scan

		*/
		else if (current == SOS) {
			readStartOfScan(inFile, header);
			break;
		} //skip
		else if (current == COM){
			readComment(inFile, header);
		} //unnecessary, skip
		else if ((current >= JPG0 && current <= JPG13) || current == DNL || current == DHP || current == EXP) {
			readComment(inFile, header);
		}
		else if (current == TEM) {
			//TEM has no size
		}
		/*
			FF may be used as a fill character before the start of any marker
			just ignore
		*/
		else if (current == 0xFF) {
			current = inFile.get();
			continue;
		} 
		else if (current == SOI) {
			std::cout << "Error -Embedded JPGs not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		} 
		else if (current == EOI) {
			std::cout << "Error - EOI detected before SOS\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current == DAC) {
			std::cout << "Error - Arithmetic Coding code not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= SOF0 && current <= SOF15) {
			std::cout << "Error - SOF marker not supported: 0x" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= RST0 && current <= RST7) {
			std::cout << "Error - RSTN detected before SOS \n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else {
			std::cout << "Error - Unknow marker 0x:" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		last = inFile.get();
		current = inFile.get();
	}

	/*
		after SOS
		压缩数据的处理
		FF00代表00
		FFFF 多个FF的话，只当做一个FF
		会遇到RST, DNL, EOI
	*/
	if (header->valid) {
		current = inFile.get();
		//read compressed image data
		while (true) {
			if (!inFile) {
				std::cout << "Error File ended premature" << std::endl;
				header->valid = false;
				inFile.close();
				return header;
			}
			last = current;
			current = inFile.get();
			//marker or FF
			if (last == 0xFF) {
				//end of image
				if (current == EOI) {
					break;
				} 
				// 0xFF00 means FF
				else if (current == 0x00) {
					header->huffmanData.push_back(last);
					current = inFile.get();
				}
				//restart marker
				else if (current >= RST0 && current <= RST7) {
					current = inFile.get();
				}
				//ignore multiple 0xFF
				else if (current == 0xFF) {
					// do nothing, one FF will be ignored.
					continue;
				}
				else {
					std::cout << "Error Invalid marker during compressed data scan: 0x" << std::hex << (uint)current << std::dec << std::endl;
					header->valid = false;
					inFile.close();
					return header;
				}
			}
			else {
				header->huffmanData.push_back(last);
			}
		}
	}

	//invalid header info
	if (header->numComponents != 1 && header->numComponents != 3) {
		std::cout << "Error - " << header->numComponents << "required color compoenent 1 or 3 \n";
		header->valid = false;
		inFile.close();
		return header;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		if (header->quantizationTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized quantization talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanACTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman AC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanDCTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman DC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
	}
	inFile.close();
	return header;
}